

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalKdevelopGenerator::Generate(cmGlobalKdevelopGenerator *this)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this_00;
  size_type sVar2;
  bool bVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  long *plVar7;
  cmGlobalKdevelopGenerator *this_01;
  string executable;
  string fileToOpen;
  string projectDir;
  string cmakeFilePattern;
  string outputDir;
  string projectName;
  string local_118;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [32];
  string local_98;
  string local_78;
  cmGlobalKdevelopGenerator *local_58;
  string local_50;
  
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var5 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    local_58 = this;
    do {
      this_00 = *(cmMakefile **)(**(long **)(p_Var5 + 2) + 0x28);
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this_00);
      std::__cxx11::string::string((string *)&local_78,pcVar4,(allocator *)&local_d8);
      pcVar4 = cmMakefile::GetHomeDirectory(this_00);
      std::__cxx11::string::string((string *)&local_d8,pcVar4,(allocator *)&local_50);
      std::__cxx11::string::string
                ((string *)&local_50,(this_00->ProjectName)._M_dataplus._M_p,(allocator *)local_b8);
      local_b8._0_8_ = local_b8 + 0x10;
      this_01 = (cmGlobalKdevelopGenerator *)local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"CMakeLists.txt;*.cmake;","");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      bVar3 = CreateFilelistFile(this_01,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                          *)(p_Var5 + 2),&local_78,&local_d8,&local_50,
                                 (string *)local_b8,&local_f8);
      if (bVar3) {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
        for (p_Var6 = *(_Base_ptr *)(p_Var5 + 2); p_Var6 != p_Var5[2]._M_parent;
            p_Var6 = (_Base_ptr)&p_Var6->_M_parent) {
          plVar7 = (long *)(*(long *)(*(long *)p_Var6 + 0x28) + 0x68);
          do {
            plVar7 = (long *)*plVar7;
            if (plVar7 == (long *)0x0) goto LAB_002c683d;
          } while (*(int *)(plVar7 + 0x61) != 0);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          pcVar4 = cmTarget::GetLocation((cmTarget *)(plVar7 + 5),&local_98);
          sVar2 = local_118._M_string_length;
          strlen(pcVar4);
          std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)sVar2,(ulong)pcVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_118._M_string_length != (char *)0x0) break;
LAB_002c683d:
        }
        this = local_58;
        CreateProjectFile(local_58,&local_78,&local_d8,&local_50,&local_118,(string *)local_b8,
                          &local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        cmSystemTools::Error("Can not create filelist file",(char *)0x0,(char *)0x0,(char *)0x0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        return;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 !=
             &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap)._M_t.
              _M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::Generate()
{
  // for each sub project in the project create
  // a kdevelop project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
      it!= this->GlobalGenerator->GetProjectMap().end();
      ++it)
    {
    cmMakefile* mf = it->second[0]->GetMakefile();
    std::string outputDir=mf->GetCurrentBinaryDirectory();
    std::string projectDir=mf->GetHomeDirectory();
    std::string projectName=mf->GetProjectName();
    std::string cmakeFilePattern("CMakeLists.txt;*.cmake;");
    std::string fileToOpen;
    const std::vector<cmLocalGenerator*>& lgs= it->second;
    // create the project.kdevelop.filelist file
    if(!this->CreateFilelistFile(lgs, outputDir, projectDir,
                                 projectName, cmakeFilePattern, fileToOpen))
      {
      cmSystemTools::Error("Can not create filelist file");
      return;
      }
    //try to find the name of an executable so we have something to
    //run from kdevelop for now just pick the first executable found
    std::string executable;
    for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
         lg!=lgs.end(); lg++)
      {
      cmMakefile* makefile=(*lg)->GetMakefile();
      cmTargets& targets=makefile->GetTargets();
      for (cmTargets::iterator ti = targets.begin();
           ti != targets.end(); ti++)
        {
        if (ti->second.GetType()==cmTarget::EXECUTABLE)
          {
          executable = ti->second.GetLocation("");
          break;
          }
        }
      if (!executable.empty())
        {
        break;
        }
      }

    // now create a project file
    this->CreateProjectFile(outputDir, projectDir, projectName,
                            executable, cmakeFilePattern, fileToOpen);
    }
}